

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loc.c
# Opt level: O3

int cook_loclists_contents(Dwarf_Debug dbg,Dwarf_Loc_Head_c llhead,Dwarf_Error *error)

{
  Dwarf_Locdesc_c pDVar1;
  long lVar2;
  Dwarf_CU_Context_conflict context;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  Dwarf_Unsigned DVar6;
  long lVar7;
  bool bVar8;
  Dwarf_Addr targaddr;
  dwarfstring_s local_68;
  Dwarf_CU_Context_conflict local_48;
  char *local_40;
  Dwarf_Error *local_38;
  
  DVar6 = llhead->ll_locdesc_count;
  if (DVar6 != 0) {
    bVar8 = llhead->ll_cu_base_address_present == 0;
    local_48 = llhead->ll_context;
    local_40 = (char *)llhead->ll_cu_base_address;
    lVar7 = 0x30;
    bVar5 = false;
    local_38 = error;
    do {
      context = local_48;
      pDVar1 = llhead->ll_locdesc;
      switch(*(undefined1 *)((long)pDVar1 + lVar7 + -0x2e)) {
      case 0:
      case 5:
        break;
      case 1:
        local_68.s_data = (char *)0x0;
        if (bVar5) {
          *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
          bVar5 = true;
          bVar8 = bVar5;
        }
        else {
          iVar3 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_48,*(Dwarf_Unsigned *)((long)pDVar1 + lVar7 + -0x18),
                             (Dwarf_Addr *)&local_68,error);
          if (iVar3 == 0) {
            local_40 = local_68.s_data;
            *(char **)((long)pDVar1 + lVar7 + -0x10) = local_68.s_data;
            bVar5 = false;
            bVar8 = bVar5;
          }
          else {
            *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
            *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
            bVar5 = true;
            bVar8 = bVar5;
            if ((error != (Dwarf_Error *)0x0) && (iVar3 == 1)) {
              dwarf_dealloc_error(dbg,*error);
              bVar5 = true;
              *error = (Dwarf_Error)0x0;
              bVar8 = bVar5;
            }
          }
        }
        break;
      case 2:
        local_68.s_data = (char *)0x0;
        if (bVar5) {
          *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
        }
        else {
          iVar3 = _dwarf_look_in_local_and_tied_by_index
                            (dbg,local_48,*(Dwarf_Unsigned *)((long)pDVar1 + lVar7 + -0x18),
                             (Dwarf_Addr *)&local_68,error);
          error = local_38;
          if (iVar3 == 0) {
            *(char **)((long)pDVar1 + lVar7 + -0x10) = local_68.s_data;
            iVar3 = _dwarf_look_in_local_and_tied_by_index
                              (dbg,context,*(Dwarf_Unsigned *)((long)pDVar1 + lVar7 + -8),
                               (Dwarf_Addr *)&local_68,local_38);
            if (iVar3 == 0) {
              *(char **)((long)&pDVar1->ld_lkind + lVar7) = local_68.s_data;
              bVar5 = false;
            }
            else {
              *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
              *(undefined8 *)((long)&pDVar1->ld_lkind + lVar7) = 0;
              bVar5 = true;
              if ((error != (Dwarf_Error *)0x0) && (iVar3 == 1)) {
                dwarf_dealloc_error(dbg,*error);
                *error = (Dwarf_Error)0x0;
              }
            }
            break;
          }
          *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
          if ((local_38 != (Dwarf_Error *)0x0) && (iVar3 == 1)) {
            dwarf_dealloc_error(dbg,*local_38);
            *error = (Dwarf_Error)0x0;
          }
        }
        *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar7) = 0;
LAB_0016f3a7:
        bVar5 = true;
        break;
      case 3:
        local_68.s_data = (char *)0x0;
        if (bVar5) {
          *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
          goto LAB_0016f3a7;
        }
        iVar3 = _dwarf_look_in_local_and_tied_by_index
                          (dbg,local_48,*(Dwarf_Unsigned *)((long)pDVar1 + lVar7 + -0x18),
                           (Dwarf_Addr *)&local_68,error);
        if (iVar3 == 0) {
          *(char **)((long)pDVar1 + lVar7 + -0x10) = local_68.s_data;
          *(char **)((long)&pDVar1->ld_lkind + lVar7) =
               local_68.s_data + *(long *)((long)pDVar1 + lVar7 + -8);
          bVar5 = false;
        }
        else {
          *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
          *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
          bVar5 = true;
          if ((error != (Dwarf_Error *)0x0) && (iVar3 == 1)) {
            dwarf_dealloc_error(dbg,*error);
            *error = (Dwarf_Error)0x0;
          }
        }
        break;
      case 4:
        if (!bVar8) {
          *(char **)((long)pDVar1 + lVar7 + -0x10) =
               local_40 + *(long *)((long)pDVar1 + lVar7 + -0x18);
          pcVar4 = local_40 + *(long *)((long)pDVar1 + lVar7 + -8);
          goto LAB_0016f59b;
        }
        *(undefined4 *)((long)pDVar1 + lVar7 + -0x2c) = 1;
        *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) = 0;
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar7) = 0;
        bVar8 = true;
        break;
      case 6:
        pcVar4 = *(char **)((long)pDVar1 + lVar7 + -0x18);
        *(char **)((long)pDVar1 + lVar7 + -0x10) = pcVar4;
        local_40 = pcVar4;
LAB_0016f59b:
        *(char **)((long)&pDVar1->ld_lkind + lVar7) = pcVar4;
        bVar8 = false;
        break;
      case 7:
        *(undefined8 *)((long)pDVar1 + lVar7 + -0x10) =
             *(undefined8 *)((long)pDVar1 + lVar7 + -0x18);
        *(undefined8 *)((long)&pDVar1->ld_lkind + lVar7) =
             *(undefined8 *)((long)pDVar1 + lVar7 + -8);
        break;
      case 8:
        lVar2 = *(long *)((long)pDVar1 + lVar7 + -0x18);
        *(long *)((long)pDVar1 + lVar7 + -0x10) = lVar2;
        *(long *)((long)&pDVar1->ld_lkind + lVar7) = lVar2 + *(long *)((long)pDVar1 + lVar7 + -8);
        break;
      default:
        dwarfstring_constructor(&local_68);
        dwarfstring_append_printf_u
                  (&local_68,
                   "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code of 0x%x is unknown. DWARF5 loclists error"
                   ,(ulong)*(byte *)((long)pDVar1 + lVar7 + -0x2e));
        pcVar4 = dwarfstring_string(&local_68);
        _dwarf_error_string(dbg,error,0x1d5,pcVar4);
        dwarfstring_destructor(&local_68);
        return 1;
      }
      lVar7 = lVar7 + 0x98;
      DVar6 = DVar6 - 1;
    } while (DVar6 != 0);
  }
  return 0;
}

Assistant:

static int
cook_loclists_contents(Dwarf_Debug dbg,
    Dwarf_Loc_Head_c llhead,
    Dwarf_Error *error)
{
    Dwarf_Unsigned baseaddress = llhead->ll_cu_base_address;
    Dwarf_Unsigned count = llhead->ll_locdesc_count;
    Dwarf_Unsigned i = 0;
    Dwarf_CU_Context cucontext = llhead->ll_context;
    int res = 0;
    Dwarf_Bool base_address_fail = FALSE;
    Dwarf_Bool debug_addr_fail = FALSE;

    if (!llhead->ll_cu_base_address_present) {
        base_address_fail = TRUE;
    }
    for (i = 0 ; i < count ; ++i) {
        Dwarf_Locdesc_c  llc = 0;

        llc = llhead->ll_locdesc +i;
        switch(llc->ld_lle_value) {
        case DW_LLE_base_addressx: {
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                base_address_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                base_address_fail = FALSE;
                baseaddress = targaddr;
                llc->ld_lopc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_endx:{
            /* two indexes into debug_addr */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
            }
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawhigh,&targaddr,
                    error);

            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_highpc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_highpc = targaddr;
            }
            break;
        }
        case DW_LLE_startx_length:{
            /* one index to debug_addr other a length */
            Dwarf_Addr targaddr = 0;
            if (debug_addr_fail) {
                res = DW_DLV_NO_ENTRY;
            } else  {
                res = _dwarf_look_in_local_and_tied_by_index(
                    dbg,cucontext,llc->ld_rawlow,&targaddr,
                    error);
            }
            if (res != DW_DLV_OK) {
                debug_addr_fail = TRUE;
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                if (res == DW_DLV_ERROR && error) {
                    dwarf_dealloc_error(dbg, *error);
                    *error = 0;
                }
            } else {
                llc->ld_lopc = targaddr;
                llc->ld_highpc = targaddr + llc->ld_rawhigh;
            }
            break;
        }
        case DW_LLE_offset_pair:{
            if (base_address_fail) {
                llc->ld_index_failed = TRUE;
                llc->ld_lopc = 0;
                llc->ld_highpc = 0;
            } else {
                /*offsets of the current base address*/
                llc->ld_lopc = llc->ld_rawlow +baseaddress;
                llc->ld_highpc = llc->ld_rawhigh +baseaddress;
            }
            break;
        }
        case DW_LLE_default_location:{
            /*  nothing to do here, just has a counted
                location description */
            break;
        }
        case DW_LLE_base_address:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow;
            baseaddress = llc->ld_rawlow;
            base_address_fail = FALSE;
            break;
        }
        case DW_LLE_start_end:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawhigh;
            break;
        }
        case DW_LLE_start_length:{
            llc->ld_lopc = llc->ld_rawlow;
            llc->ld_highpc = llc->ld_rawlow + llc->ld_rawhigh;
            break;
        }
        case DW_LLE_end_of_list:{
            /* do nothing */
            break;
        }
        default: {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: improper DW_LLE code "
                "of 0x%x is unknown. DWARF5 loclists error",
                llc->ld_lle_value);
            _dwarf_error_string(dbg,error,
                DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
            return DW_DLV_ERROR;
        }
        }
    }
    return DW_DLV_OK;
}